

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Octree.cpp
# Opt level: O3

int new_node(float txm,int x,float tym,int y,float tzm,int z)

{
  if (tym <= txm) {
    if (tym < tzm) {
      return y;
    }
  }
  else if (txm < tzm) {
    return x;
  }
  return z;
}

Assistant:

int
new_node(float txm, int x,
         float tym, int y,
         float tzm, int z) {
    if (txm < tym) {
        if (txm < tzm) {
            return x;
        }
    } else {
        if (tym < tzm) {
            return y;
        }
    }
    return z;
}